

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pprVar5;
  undefined4 extraout_var;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  element_type *peVar6;
  undefined4 extraout_var_00;
  element_type *peVar7;
  undefined4 extraout_var_01;
  ulong local_30;
  size_t i;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *repl_local;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *e_local;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar4 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::size(e);
    if (sVar4 <= local_30) {
      this_00 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
      peVar6 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_)
      ;
      iVar2 = (*peVar6->_vptr_rt_expression_interface[0xf])(peVar6,e,repl);
      peVar7 = std::
               auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
               operator->(&this->op_);
      iVar3 = (*peVar7->_vptr_op_interface[2])();
      rt_unary_expr(this_00,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                    (op_interface_type *)CONCAT44(extraout_var_01,iVar3));
      return &this_00->super_rt_expression_interface<double>;
    }
    pprVar5 = std::
              vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
              ::operator[](e,local_30);
    uVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,*pprVar5);
    if ((uVar1 & 1) != 0) break;
    local_30 = local_30 + 1;
  }
  pprVar5 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::operator[](repl,local_30);
  iVar2 = (*(*pprVar5)->_vptr_rt_expression_interface[2])();
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (std::size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_unary_expr(expr_->substitute(e, repl),
                              op_->clone());
      }